

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

void __thiscall ncnn::PoolAllocator::PoolAllocator(PoolAllocator *this)

{
  pthread_mutex_t *__mutex;
  
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__PoolAllocator_00370c90;
  __mutex = (pthread_mutex_t *)operator_new(0x88);
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  pthread_mutex_init(__mutex + 1,(pthread_mutexattr_t *)0x0);
  *(long *)((long)__mutex + 0x60) = (long)__mutex + 0x58;
  *(long *)((long)__mutex + 0x58) = (long)__mutex + 0x58;
  *(undefined8 *)((long)__mutex + 0x68) = 0;
  __mutex[3].__align = (long)__mutex + 0x70;
  *(long *)((long)__mutex + 0x70) = (long)__mutex + 0x70;
  *(undefined8 *)((long)__mutex + 0x80) = 0;
  this->d = (PoolAllocatorPrivate *)__mutex;
  __mutex[2].__data.__lock = 0xc0;
  return;
}

Assistant:

PoolAllocator::PoolAllocator()
    : Allocator(), d(new PoolAllocatorPrivate)
{
    d->size_compare_ratio = 192; // 0.75f * 256
}